

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O3

bool __thiscall QToolBarPrivate::mouseMoveEvent(QToolBarPrivate *this,QMouseEvent *event)

{
  bool bVar1;
  Orientation OVar2;
  DragState *pDVar3;
  QWidget *this_00;
  QLayoutItem *hoverTarget;
  QWidgetData *pQVar4;
  bool bVar5;
  ulong uVar6;
  Representation RVar7;
  LayoutDirection LVar8;
  int iVar9;
  QMainWindow *mainWindow;
  QMainWindowLayout *this_01;
  QPoint QVar10;
  QWidget *pQVar11;
  QWindow *context;
  undefined8 uVar12;
  QRect *pQVar13;
  Representation *pRVar14;
  DragState *pDVar15;
  long in_FS_OFFSET;
  int iVar16;
  int iVar19;
  double dVar17;
  double extraout_XMM0_Qa;
  undefined1 auVar18 [16];
  int iVar20;
  int iVar21;
  double dVar22;
  undefined1 auVar23 [16];
  QPointF QVar24;
  undefined1 auVar25 [16];
  int local_a8;
  int iStack_a4;
  QPointF local_78;
  QPointF local_68;
  QPointF local_58;
  undefined1 local_48 [16];
  QLayoutItem *local_38;
  
  local_38 = *(QLayoutItem **)(in_FS_OFFSET + 0x28);
  pDVar3 = this->state;
  if (pDVar3 == (DragState *)0x0) goto LAB_004ad5ff;
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  mainWindow = (QMainWindow *)QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
  if (mainWindow == (QMainWindow *)0x0) goto LAB_004ad5ff;
  this_01 = qt_mainwindow_layout(mainWindow);
  if (this_01->pluggingWidget == (QWidget *)0x0) {
    auVar23 = QEventPoint::position();
    auVar25._0_8_ =
         (double)((ulong)auVar23._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar23._0_8_;
    auVar25._8_8_ =
         (double)((ulong)auVar23._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar23._8_8_;
    auVar23 = maxpd(auVar25,_DAT_006605e0);
    QVar10 = this->state->pressPos;
    iVar16 = (int)(double)(~-(ulong)(2147483647.0 < auVar25._0_8_) & auVar23._0_8_ |
                          -(ulong)(2147483647.0 < auVar25._0_8_) & 0x41dfffffffc00000) -
             QVar10.xp.m_i;
    iVar19 = (int)(double)(~-(ulong)(2147483647.0 < auVar25._8_8_) & auVar23._8_8_ |
                          -(ulong)(2147483647.0 < auVar25._8_8_) & 0x41dfffffffc00000) -
             QVar10.yp.m_i;
    iVar20 = iVar16 >> 0x1f;
    iVar21 = iVar19 >> 0x1f;
    uVar6 = CONCAT44(iVar19,iVar16) ^ CONCAT44(iVar21,iVar20);
    iVar16 = QApplication::startDragDistance();
    if (iVar16 < ((int)(uVar6 >> 0x20) - iVar21) + ((int)uVar6 - iVar20)) {
      bVar1 = this->state->dragging;
      if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
        OVar2 = this->orientation;
        QVar24 = (QPointF)QEventPoint::position();
        if (OVar2 == Vertical) {
          local_48 = (undefined1  [16])QVar24;
          QVar10 = QPointF::toPoint((QPointF *)local_48);
          if (QVar10.xp.m_i.m_i < 0) goto LAB_004ad1d1;
          local_58 = (QPointF)QEventPoint::position();
          QVar10 = QPointF::toPoint(&local_58);
          RVar7 = QVar10.xp.m_i;
          pQVar13 = &this_00->data->crect;
          pRVar14 = &(this_00->data->crect).x2;
        }
        else {
          local_68 = QVar24;
          QVar10 = QPointF::toPoint(&local_68);
          if ((long)QVar10 < 0) goto LAB_004ad1d1;
          local_78 = (QPointF)QEventPoint::position();
          QVar10 = QPointF::toPoint(&local_78);
          RVar7 = QVar10.yp.m_i;
          pRVar14 = &(this_00->data->crect).y2;
          pQVar13 = (QRect *)&(this_00->data->crect).y1;
        }
        iVar16 = (pRVar14->m_i - (pQVar13->x1).m_i) + 1;
        startDrag(this,RVar7.m_i < iVar16);
        if (iVar16 <= RVar7.m_i && (bVar1 & 1U) == 0) {
LAB_004ad1e5:
          QWidget::grabMouse(this_00);
        }
      }
      else {
LAB_004ad1d1:
        startDrag(this,false);
        if (bVar1 == false) goto LAB_004ad1e5;
      }
    }
  }
  pDVar15 = this->state;
  if (pDVar15 == (DragState *)0x0) {
    QWidget::releaseMouse(this_00);
    goto LAB_004ad5ff;
  }
  if (pDVar15->dragging == true) {
    local_48._0_4_ = -0x55555556;
    auVar25 = QEventPoint::globalPosition();
    dVar22 = (double)((ulong)auVar25._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar25._0_8_;
    bVar1 = 2147483647.0 < dVar22;
    if (dVar22 <= -2147483648.0) {
      dVar22 = -2147483648.0;
    }
    dVar17 = (double)((ulong)auVar25._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar25._8_8_;
    bVar5 = 2147483647.0 < dVar17;
    if (dVar17 <= -2147483648.0) {
      dVar17 = -2147483648.0;
    }
    LVar8 = QWidget::layoutDirection(this_00);
    iVar16 = (this->state->pressPos).xp.m_i;
    if (LVar8 == LeftToRight) {
      iVar16 = -iVar16;
    }
    else {
      iVar16 = iVar16 + ~(this_00->data->crect).x2.m_i + (this_00->data->crect).x1.m_i;
    }
    local_48._4_4_ =
         (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar17) -
         (this->state->pressPos).yp.m_i;
    local_48._0_4_ =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar22) + iVar16
    ;
    QWidget::move(this_00,(QPoint *)local_48);
    hoverTarget = this->state->widgetItem;
    auVar25 = QEventPoint::globalPosition();
    dVar22 = (double)((ulong)auVar25._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar25._0_8_;
    bVar1 = 2147483647.0 < dVar22;
    if (dVar22 <= -2147483648.0) {
      dVar22 = -2147483648.0;
    }
    dVar17 = (double)((ulong)auVar25._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar25._8_8_;
    bVar5 = 2147483647.0 < dVar17;
    if (dVar17 <= -2147483648.0) {
      dVar17 = -2147483648.0;
    }
    local_58.xp = (qreal)CONCAT44((int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 |
                                               ~-(ulong)bVar5 & (ulong)dVar17),
                                  (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 |
                                               ~-(ulong)bVar1 & (ulong)dVar22));
    QMainWindowLayout::hover((QMainWindowLayout *)this_01,hoverTarget,(QPoint *)&local_58);
    goto LAB_004ad5ff;
  }
  if (pDVar15->moving != true) goto LAB_004ad5ff;
  local_48._4_4_ = (pDVar15->pressPos).yp.m_i;
  local_48._0_4_ =
       ((this_00->data->crect).x2.m_i - ((this_00->data->crect).x1.m_i + (pDVar15->pressPos).xp.m_i)
       ) + 1;
  LVar8 = QWidget::layoutDirection(this_00);
  if (LVar8 == RightToLeft) {
    pDVar15 = (DragState *)local_48;
  }
  else {
    pDVar15 = this->state;
  }
  QVar10 = QWidget::mapToGlobal(this_00,&pDVar15->pressPos);
  local_58.xp = (qreal)QVar10;
  pQVar11 = QWidget::window(this_00);
  if (pQVar11 == (QWidget *)0x0) {
LAB_004ad512:
    auVar25 = QEventPoint::globalPosition();
    auVar23._0_8_ =
         (double)((ulong)auVar25._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar25._8_8_;
    auVar23._8_8_ =
         (double)((ulong)auVar25._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar25._0_8_;
    auVar25 = maxpd(auVar23,_DAT_006605e0);
    local_a8 = (int)(double)(~-(ulong)(2147483647.0 < auVar23._0_8_) & auVar25._0_8_ |
                            -(ulong)(2147483647.0 < auVar23._0_8_) & 0x41dfffffffc00000) -
               QVar10.yp.m_i;
    iStack_a4 = (int)(double)(~-(ulong)(2147483647.0 < auVar23._8_8_) & auVar25._8_8_ |
                             -(ulong)(2147483647.0 < auVar23._8_8_) & 0x41dfffffffc00000) -
                QVar10.xp.m_i;
  }
  else {
    pQVar11 = QWidget::window(this_00);
    context = QWidget::windowHandle(pQVar11);
    if (context == (QWindow *)0x0) goto LAB_004ad512;
    auVar25 = QEventPoint::globalPosition();
    uVar12 = QHighDpiScaling::scaleAndOrigin(context,(Point)ZEXT812(0));
    QVar10 = QHighDpi::fromNativePixels<QPoint,QWindow>((QPoint *)&local_58,context);
    dVar22 = (double)(int)((ulong)uVar12 >> 0x20);
    dVar22 = (1.0 / extraout_XMM0_Qa) * (auVar25._8_8_ - dVar22) + dVar22;
    dVar17 = (1.0 / extraout_XMM0_Qa) * (auVar25._0_8_ - (double)(int)uVar12) + (double)(int)uVar12;
    auVar18._0_8_ = (double)((ulong)dVar22 & 0x8000000000000000 | 0x3fe0000000000000) + dVar22;
    auVar18._8_8_ = (double)((ulong)dVar17 & 0x8000000000000000 | 0x3fe0000000000000) + dVar17;
    auVar25 = maxpd(auVar18,_DAT_006605e0);
    local_a8 = (int)(double)(~-(ulong)(2147483647.0 < auVar18._0_8_) & auVar25._0_8_ |
                            -(ulong)(2147483647.0 < auVar18._0_8_) & 0x41dfffffffc00000) -
               QVar10.yp.m_i;
    iStack_a4 = (int)(double)(~-(ulong)(2147483647.0 < auVar18._8_8_) & auVar25._8_8_ |
                             -(ulong)(2147483647.0 < auVar18._8_8_) & 0x41dfffffffc00000) -
                QVar10.xp.m_i;
  }
  if (this->orientation == Vertical) {
    iVar16 = QWidget::y(this_00);
LAB_004ad5ea:
    local_a8 = local_a8 + iVar16;
  }
  else {
    LVar8 = QWidget::layoutDirection(this_00);
    if (LVar8 != RightToLeft) {
      iVar16 = QWidget::x(this_00);
      local_a8 = iStack_a4;
      goto LAB_004ad5ea;
    }
    pQVar4 = (mainWindow->super_QWidget).data;
    iVar16 = (pQVar4->crect).x2.m_i;
    iVar19 = (pQVar4->crect).x1.m_i;
    iVar20 = (this_00->data->crect).x2.m_i;
    iVar21 = (this_00->data->crect).x1.m_i;
    iVar9 = QWidget::x(this_00);
    local_a8 = (iVar16 + iVar21) - (iVar9 + iStack_a4 + iVar19 + iVar20);
  }
  QMainWindowLayout::moveToolBar((QMainWindowLayout *)this_01,(QToolBar *)this_00,local_a8);
LAB_004ad5ff:
  if (*(QLayoutItem **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pDVar3 != (DragState *)0x0;
}

Assistant:

bool QToolBarPrivate::mouseMoveEvent(QMouseEvent *event)
{
    Q_Q(QToolBar);

    if (!state) {
#ifdef Q_OS_MACOS
        if (!macWindowDragging)
            return false;
        QWidget *w = q->window();
        const QPoint delta = event->pos() - macWindowDragPressPosition;
        w->move(w->pos() + delta);
        return true;
#endif
        return false;
    }

    QMainWindow *win = qobject_cast<QMainWindow*>(parent);
    if (win == nullptr)
        return true;

    QMainWindowLayout *layout = qt_mainwindow_layout(win);
    Q_ASSERT(layout != nullptr);

    if (layout->pluggingWidget == nullptr
        && (event->position().toPoint() - state->pressPos).manhattanLength() > QApplication::startDragDistance()) {
            const bool wasDragging = state->dragging;
            const bool moving = !q->isWindow() && (orientation == Qt::Vertical ?
                event->position().toPoint().x() >= 0 && event->position().toPoint().x() < q->width() :
                event->position().toPoint().y() >= 0 && event->position().toPoint().y() < q->height());

            startDrag(moving);
            if (!moving && !wasDragging)
                q->grabMouse();
    }

    if (!state) {
        q->releaseMouse();
        return true;
    }

    if (state->dragging) {
        QPoint pos = event->globalPosition().toPoint();
        // if we are right-to-left, we move so as to keep the right edge the same distance
        // from the mouse
        if (q->isLeftToRight())
            pos -= state->pressPos;
        else
            pos += QPoint(state->pressPos.x() - q->width(), -state->pressPos.y());

        q->move(pos);
        layout->hover(state->widgetItem, event->globalPosition().toPoint());
    } else if (state->moving) {

        const QPoint rtl(q->width() - state->pressPos.x(), state->pressPos.y()); //for RTL
        const QPoint globalPressPos = q->mapToGlobal(q->isRightToLeft() ? rtl : state->pressPos);
        int pos = 0;

        const QWindow *handle = q->window() ? q->window()->windowHandle() : nullptr;
        const QPoint delta = handle
                ? QHighDpi::fromNativePixels(event->globalPosition(), handle).toPoint()
                  - QHighDpi::fromNativePixels(globalPressPos, handle)
                : event->globalPosition().toPoint() - globalPressPos;

        if (orientation == Qt::Vertical) {
            pos = q->y() + delta.y();
        } else {
            if (q->isRightToLeft()) {
                pos = win->width() - q->width() - q->x()  - delta.x();
            } else {
                pos = q->x() + delta.x();
            }
        }

        layout->moveToolBar(q, pos);
    }
    return true;
}